

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gateway.hpp
# Opt level: O3

void __thiscall
ableton::link::
Gateway<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::GatewayObserver,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
::updateNodeState(Gateway<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::GatewayObserver,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
                  *this,pair<ableton::link::NodeState,_ableton::link::GhostXForm> *state)

{
  rep rVar1;
  NodeIdArray NVar2;
  NodeIdArray NVar3;
  tuple<double> tVar4;
  tuple<long> tVar5;
  data_union local_90;
  NodeState local_68;
  
  PingResponder<ableton::platforms::asio::AsioService_&,_ableton::platforms::linux::Clock<1>,_ableton::discovery::Socket<512UL>,_ableton::util::NullLog>
  ::updateNodeState(&(this->mMeasurement).mPingResponder,&(state->first).sessionId,&state->second);
  NVar2._M_elems = *&(state->first).nodeId.super_NodeIdArray._M_elems;
  NVar3._M_elems = *&(state->first).sessionId.super_NodeIdArray._M_elems;
  tVar4.super__Tuple_impl<0UL,_double>.super__Head_base<0UL,_double,_false>._M_head_impl =
       (_Tuple_impl<0UL,_double>)
       (state->first).timeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  tVar5.super__Tuple_impl<0UL,_long>.super__Head_base<0UL,_long,_false>._M_head_impl =
       (_Tuple_impl<0UL,_long>)
       (state->first).timeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
       super__Head_base<0UL,_long,_false>._M_head_impl;
  rVar1 = (state->first).timeline.timeOrigin.__r;
  asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::local_endpoint
            ((endpoint_type *)&local_90.base,
             (basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *)
             (((this->mMeasurement).mPingResponder.mpImpl.
               super___shared_ptr<ableton::link::PingResponder<ableton::platforms::asio::AsioService_&,_ableton::platforms::linux::Clock<1>,_ableton::discovery::Socket<512UL>,_ableton::util::NullLog>::Impl,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->mSocket).mpImpl.
             super___shared_ptr<ableton::discovery::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  local_68.endpoint.impl_.data_._0_8_ = local_90._0_8_;
  local_68.endpoint.impl_.data_._20_8_ = local_90._20_8_;
  local_68.nodeState.nodeId.super_NodeIdArray._M_elems = (NodeIdArray)(NodeIdArray)NVar2._M_elems;
  local_68.nodeState.sessionId.super_NodeIdArray._M_elems = (NodeIdArray)(NodeIdArray)NVar3._M_elems
  ;
  local_68.nodeState.timeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (tuple<double>)
       (tuple<double>)
       tVar4.super__Tuple_impl<0UL,_double>.super__Head_base<0UL,_double,_false>._M_head_impl;
  local_68.nodeState.timeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl =
       (tuple<long>)
       (tuple<long>)
       tVar5.super__Tuple_impl<0UL,_long>.super__Head_base<0UL,_long,_false>._M_head_impl;
  local_68.nodeState.timeline.timeOrigin.__r = rVar1;
  discovery::
  PeerGateway<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>,_ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::GatewayObserver,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
  ::Impl::updateState((this->mPeerGateway).mpImpl.
                      super___shared_ptr<ableton::discovery::PeerGateway<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>,_ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::GatewayObserver,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,&local_68);
  return;
}

Assistant:

void updateNodeState(std::pair<NodeState, GhostXForm> state)
  {
    mMeasurement.updateNodeState(state.first.sessionId, state.second);
    mPeerGateway.updateState(PeerState{std::move(state.first), mMeasurement.endpoint()});
  }